

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::SchemaParser::ModuleImpl::embedRelative
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,ModuleImpl *this,
          StringPtr embedPath)

{
  SchemaFile *pSVar1;
  char *pcVar2;
  size_t sVar3;
  OwnOwn<capnp::SchemaFile> importedFile;
  Array<const_unsigned_char> result;
  Own<capnp::SchemaFile> local_68;
  Array<const_char> local_58;
  Array<const_unsigned_char> local_38;
  
  pSVar1 = (this->file).ptr;
  (*pSVar1->_vptr_SchemaFile[2])(&local_38,pSVar1,embedPath.content.ptr,embedPath.content.size_);
  sVar3 = local_38.size_;
  local_68.disposer = (Disposer *)local_38.ptr;
  local_68.ptr = (SchemaFile *)local_38.size_;
  local_38.size_ = 0;
  kj::Own<capnp::SchemaFile>::dispose((Own<capnp::SchemaFile> *)&local_38);
  if ((SchemaFile *)sVar3 == (SchemaFile *)0x0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (*(*(_func_int ***)sVar3)[1])(&local_58,sVar3);
    sVar3 = local_58.size_;
    pcVar2 = local_58.ptr;
    local_38.disposer = local_58.disposer;
    local_58.ptr = (char *)0x0;
    local_58.size_ = 0;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = (uchar *)pcVar2;
    (__return_storage_ptr__->ptr).field_1.value.size_ = sVar3;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_58.disposer;
    local_38.ptr = (uchar *)0x0;
    local_38.size_ = 0;
    kj::Array<const_unsigned_char>::~Array(&local_38);
    kj::Array<const_char>::~Array(&local_58);
  }
  kj::Own<capnp::SchemaFile>::dispose(&local_68);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    KJ_IF_MAYBE(importedFile, file->import(embedPath)) {
      return importedFile->get()->readContent().releaseAsBytes();
    } else {
      return nullptr;
    }
  }